

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

uint PrintStackFrame(int address,char *current,uint bufSize,bool withVariables)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ExternFuncInfo *pEVar6;
  char *pcVar7;
  byte *pbVar8;
  ExternVarInfo *pEVar9;
  ExternLocalInfo *pEVar10;
  int iVar11;
  undefined7 in_register_00000009;
  ulong uVar12;
  char *pcVar13;
  int *piVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint *puVar18;
  ExternTypeInfo *pEVar19;
  byte *pbVar20;
  ulong uVar21;
  byte *pbVar22;
  char *pcVar23;
  byte *pbVar24;
  char *pcVar25;
  char *pcVar26;
  uint exVariablesSize;
  ExternTypeInfo *local_60;
  char *local_58;
  ExternFuncInfo *local_50;
  uint exInfoSize;
  uint exModulesSize;
  ExternModuleInfo *local_40;
  uint exTypesSize;
  uint exFunctionsSize;
  
  local_58 = (char *)CONCAT44(local_58._4_4_,(int)CONCAT71(in_register_00000009,withVariables));
  exFunctionsSize = 0;
  pEVar6 = nullcDebugFunctionInfo(&exFunctionsSize);
  pcVar7 = nullcDebugSymbols((uint *)0x0);
  exModulesSize = 0;
  local_40 = nullcDebugModuleInfo(&exModulesSize);
  exInfoSize = 0;
  local_60 = (ExternTypeInfo *)nullcDebugSourceInfo(&exInfoSize);
  pbVar8 = (byte *)nullcDebugSource();
  local_50 = pEVar6;
  if ((ulong)exFunctionsSize != 0) {
    piVar14 = &pEVar6->regVmCodeSize;
    uVar12 = 0xffffffff;
    uVar21 = 0;
    do {
      if ((piVar14[-1] <= address) && (address < piVar14[-1] + *piVar14)) {
        uVar12 = uVar21 & 0xffffffff;
      }
      uVar21 = uVar21 + 1;
      piVar14 = piVar14 + 0x25;
    } while (exFunctionsSize != uVar21);
    if ((int)uVar12 != -1) {
      lVar17 = (long)(int)uVar12;
      bVar3 = false;
      iVar4 = NULLC::SafeSprintf(current,(ulong)bufSize,"%s",pcVar7 + pEVar6[lVar17].offsetToName);
      goto LAB_0012a93b;
    }
  }
  pcVar25 = "global scope";
  if (address == -1) {
    pcVar25 = "external";
  }
  iVar4 = NULLC::SafeSprintf(current,(ulong)bufSize,"%s",pcVar25);
  lVar17 = -1;
  bVar3 = true;
LAB_0012a93b:
  pcVar25 = current + iVar4;
  if (address != -1) {
    uVar12 = (ulong)(exInfoSize - 1);
    lVar15 = 1;
    pEVar19 = local_60;
    do {
      pEVar19 = (ExternTypeInfo *)((long)pEVar19 + 0xc);
      if (uVar12 + lVar15 == 1) goto LAB_0012a97d;
      lVar15 = lVar15 + -1;
    } while (((ExternSourceInfo *)pEVar19)->instruction <= address - 1U);
    uVar12 = -lVar15;
LAB_0012a97d:
    uVar12 = (ulong)((ExternSourceInfo *)((long)local_60 + uVar12 * 0xc))->sourceOffset;
    do {
      uVar21 = uVar12;
      pbVar22 = pbVar8;
      if (uVar21 == 0) goto LAB_0012a9b5;
      uVar12 = uVar21 - 1;
    } while (pbVar8[uVar21 - 1] != 10);
    pbVar22 = pbVar8 + uVar21;
LAB_0012a9b5:
    for (; (bVar1 = *pbVar22, bVar1 == 9 || (bVar1 == 0x20)); pbVar22 = pbVar22 + 1) {
    }
    if ((ulong)exModulesSize == 0) {
      pbVar20 = (byte *)0x0;
    }
    else {
      puVar18 = &local_40->sourceSize;
      uVar16 = 0xffffffff;
      uVar12 = 0;
      pbVar20 = (byte *)0x0;
      do {
        pbVar24 = pbVar8 + puVar18[-1];
        if (((pbVar22 < pbVar24) && (pbVar20 <= pbVar22)) && (pbVar20 < pbVar24)) break;
        pbVar20 = pbVar24 + *puVar18;
        uVar5 = uVar16;
        if (pbVar22 < pbVar20) {
          uVar5 = (uint)uVar12;
        }
        if (pbVar24 <= pbVar22) {
          uVar16 = uVar5;
        }
        uVar12 = uVar12 + 1;
        puVar18 = puVar18 + 7;
      } while (exModulesSize != uVar12);
      if (uVar16 != 0xffffffff) {
        pbVar20 = pbVar8 + local_40[uVar16].sourceOffset;
      }
    }
    uVar12 = 1;
    if (pbVar20 < pbVar22) {
      iVar11 = 0;
      do {
        bVar2 = *pbVar20;
        pbVar20 = pbVar20 + 1;
        iVar11 = iVar11 + (uint)(bVar2 == 10);
      } while (pbVar20 < pbVar22);
      uVar12 = (ulong)(iVar11 + 1);
    }
    lVar15 = 0;
    while ((0xd < bVar1 || ((0x2401U >> (bVar1 & 0x1f) & 1) == 0))) {
      bVar1 = pbVar22[lVar15 + 1];
      lVar15 = lVar15 + 1;
    }
    iVar4 = NULLC::SafeSprintf(pcVar25,(ulong)(bufSize - iVar4)," (line %d: at %.*s)\r\n",uVar12);
    pcVar25 = pcVar25 + iVar4;
  }
  if ((char)local_58 != '\0') {
    exTypesSize = 0;
    local_60 = nullcDebugTypeInfo(&exTypesSize);
    local_58 = current;
    if (bVar3) {
      exVariablesSize = 0;
      pEVar9 = nullcDebugVariableInfo(&exVariablesSize);
      pEVar19 = local_60;
      if (exVariablesSize != 0) {
        puVar18 = &pEVar9->offset;
        uVar12 = 0;
        pcVar26 = current;
        do {
          current = local_58;
          iVar4 = NULLC::SafeSprintf(pcVar25,(ulong)(((int)pcVar26 - (int)pcVar25) + bufSize),
                                     " %s %d: %s %s (at %d size %d)\r\n","global",
                                     uVar12 & 0xffffffff,pcVar7 + pEVar19[puVar18[-1]].offsetToName,
                                     pcVar7 + ((ExternVarInfo *)(puVar18 + -3))->offsetToName,
                                     (ulong)*puVar18,(ulong)pEVar19[puVar18[-1]].size);
          pcVar25 = pcVar25 + iVar4;
          uVar12 = uVar12 + 1;
          puVar18 = puVar18 + 4;
          pcVar26 = current;
        } while (uVar12 < exVariablesSize);
      }
    }
    else {
      exVariablesSize = 0;
      pEVar10 = nullcDebugLocalInfo(&exVariablesSize);
      if (local_50[lVar17].externCount + local_50[lVar17].localCount != 0) {
        local_50 = local_50 + lVar17;
        uVar16 = 0;
        pcVar26 = current;
        do {
          current = local_58;
          uVar5 = local_50->offsetToFirstLocal + uVar16;
          bVar1 = pEVar10[uVar5].paramType;
          pcVar13 = "local";
          if (bVar1 == 2) {
            pcVar13 = "extern";
          }
          if (bVar1 == 0) {
            pcVar13 = "param";
          }
          pcVar23 = "base";
          if ((1 < bVar1) && (pcVar23 = "local", -1 < (int)pEVar10[uVar5].closeListID)) {
            pcVar23 = "closure";
          }
          iVar4 = NULLC::SafeSprintf(pcVar25,(ulong)(((int)pcVar26 - (int)pcVar25) + bufSize),
                                     " %s %d: %s %s (at %s+%d size %d)\r\n",pcVar13,(ulong)uVar16,
                                     pcVar7 + local_60[pEVar10[uVar5].type].offsetToName,
                                     pcVar7 + pEVar10[uVar5].offsetToName,pcVar23,
                                     (ulong)pEVar10[uVar5].offset,
                                     (ulong)local_60[pEVar10[uVar5].type].size);
          pcVar25 = pcVar25 + iVar4;
          uVar16 = uVar16 + 1;
          pcVar26 = current;
        } while (uVar16 < local_50->externCount + local_50->localCount);
      }
    }
  }
  return (int)pcVar25 - (int)current;
}

Assistant:

unsigned int PrintStackFrame(int address, char* current, unsigned int bufSize, bool withVariables)
{
	const char *start = current;

	unsigned exFunctionsSize = 0;
	ExternFuncInfo *exFunctions = nullcDebugFunctionInfo(&exFunctionsSize);

	char *exSymbols = nullcDebugSymbols(NULL);

	unsigned exModulesSize = 0;
	ExternModuleInfo *exModules = nullcDebugModuleInfo(&exModulesSize);

	unsigned exInfoSize = 0;
	ExternSourceInfo *exInfo = nullcDebugSourceInfo(&exInfoSize);

	char *source = nullcDebugSource();

	int funcID = -1;
	for(unsigned int i = 0; i < exFunctionsSize; i++)
	{
		if(address >= exFunctions[i].regVmAddress && address < (exFunctions[i].regVmAddress + exFunctions[i].regVmCodeSize))
			funcID = i;
	}

	if(funcID != -1)
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), "%s", &exSymbols[exFunctions[funcID].offsetToName]);
	else
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), "%s", address == -1 ? "external" : "global scope");

	if(address != -1)
	{
		unsigned int infoID = 0;
		unsigned int i = address - 1;
		while((infoID < exInfoSize - 1) && (i >= exInfo[infoID + 1].instruction))
			infoID++;
		const char *codeStart = source + exInfo[infoID].sourceOffset;

		// Find beginning of the line
		while(codeStart != source && *(codeStart-1) != '\n')
			codeStart--;

		// Skip whitespace
		while(*codeStart == ' ' || *codeStart == '\t')
			codeStart++;
		const char *codeEnd = codeStart;

		// Find corresponding module
		unsigned moduleID = ~0u;
		const char *prevEnd = NULL;
		for(unsigned l = 0; l < exModulesSize; l++)
		{
			// special check for main module
			if(source + exModules[l].sourceOffset > prevEnd && codeStart >= prevEnd && codeStart < source + exModules[l].sourceOffset)
				break;
			if(codeStart >= source + exModules[l].sourceOffset && codeStart < source + exModules[l].sourceOffset + exModules[l].sourceSize)
				moduleID = l;
			prevEnd = source + exModules[l].sourceOffset + exModules[l].sourceSize;
		}
		const char *moduleStart = NULL;
		if(moduleID != ~0u)
			moduleStart = source + exModules[moduleID].sourceOffset;
		else
			moduleStart = prevEnd;

		// Find line number
		unsigned line = 0;
		while(moduleStart < codeStart)
		{
			if(*moduleStart++ == '\n')
				line++;
		}

		// Find ending of the line
		while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
			codeEnd++;

		int codeLength = (int)(codeEnd - codeStart);
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), " (line %d: at %.*s)\r\n", line + 1, codeLength, codeStart);
	}

	if(withVariables)
	{
		unsigned exTypesSize = 0;
		ExternTypeInfo *exTypes = nullcDebugTypeInfo(&exTypesSize);

		if(funcID != -1)
		{
			unsigned exLocalsSize = 0;
			ExternLocalInfo *exLocals = nullcDebugLocalInfo(&exLocalsSize);

			for(unsigned int i = 0; i < exFunctions[funcID].localCount + exFunctions[funcID].externCount; i++)
			{
				ExternLocalInfo &lInfo = exLocals[exFunctions[funcID].offsetToFirstLocal + i];
				const char *typeName = &exSymbols[exTypes[lInfo.type].offsetToName];
				const char *localName = &exSymbols[lInfo.offsetToName];
				const char *localType = lInfo.paramType == ExternLocalInfo::PARAMETER ? "param" : (lInfo.paramType == ExternLocalInfo::EXTERNAL ? "extern" : "local");
				const char *offsetType = (lInfo.paramType == ExternLocalInfo::PARAMETER || lInfo.paramType == ExternLocalInfo::LOCAL) ? "base" : (lInfo.closeListID & 0x80000000 ? "local" : "closure");
				current += NULLC::SafeSprintf(current, bufSize - int(current - start), " %s %d: %s %s (at %s+%d size %d)\r\n",	localType, i, typeName, localName, offsetType, lInfo.offset, exTypes[lInfo.type].size);
			}
		}
		else
		{
			unsigned exVariablesSize = 0;
			ExternVarInfo *exVariables = nullcDebugVariableInfo(&exVariablesSize);

			for(unsigned i = 0; i < exVariablesSize; i++)
			{
				ExternVarInfo &vInfo = exVariables[i];

				const char *typeName = &exSymbols[exTypes[vInfo.type].offsetToName];
				const char *localName = &exSymbols[vInfo.offsetToName];
				const char *localType = "global";
				current += NULLC::SafeSprintf(current, bufSize - int(current - start), " %s %d: %s %s (at %d size %d)\r\n", localType, i, typeName, localName, vInfo.offset, exTypes[vInfo.type].size);
			}
		}
	}

	return (unsigned int)(current - start);
}